

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.h
# Opt level: O0

void __thiscall
CoreML::Specification::CustomModel_CustomModelParamValue::set_stringvalue
          (CustomModel_CustomModelParamValue *this,string *value)

{
  bool bVar1;
  string *psVar2;
  string *value_local;
  CustomModel_CustomModelParamValue *this_local;
  
  bVar1 = has_stringvalue(this);
  if (!bVar1) {
    clear_value(this);
    set_has_stringvalue(this);
    psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
              (&(this->value_).stringvalue_,psVar2);
  }
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::SetNoArena(&(this->value_).stringvalue_,psVar2,value);
  return;
}

Assistant:

inline void CustomModel_CustomModelParamValue::set_stringvalue(const ::std::string& value) {
  // @@protoc_insertion_point(field_set:CoreML.Specification.CustomModel.CustomModelParamValue.stringValue)
  if (!has_stringvalue()) {
    clear_value();
    set_has_stringvalue();
    value_.stringvalue_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  }
  value_.stringvalue_.SetNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), value);
  // @@protoc_insertion_point(field_set:CoreML.Specification.CustomModel.CustomModelParamValue.stringValue)
}